

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsComponentAddPartSubEntities
              (FmsComponent comp,FmsInt part_id,FmsEntityType type,FmsIntType id_store_type,
              FmsIntType ent_id_type,void *ents,FmsInt num_ents)

{
  ulong uVar1;
  size_t sVar2;
  long *plVar3;
  FmsInt FVar4;
  void *pvVar5;
  uint in_ECX;
  uint in_EDX;
  ulong in_RSI;
  long in_RDI;
  uint in_R8D;
  long in_R9;
  FmsInt nc;
  size_t sizeof_ent_ids;
  void *entities_ids;
  FmsInt num_entities;
  _FmsPart_private *part;
  FmsInt in_stack_000001f0;
  void *in_stack_000001f8;
  FmsIntType in_stack_00000204;
  void *in_stack_00000208;
  FmsIntType in_stack_00000210;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RSI < *(ulong *)(in_RDI + 0x20)) {
    if (in_EDX < 8) {
      if ((*(long *)(in_RDI + 0x10) == 0x7f) || (FmsEntityDim[in_EDX] < *(ulong *)(in_RDI + 0x10)))
      {
        if (in_ECX < 8) {
          if (in_R8D < 8) {
            plVar3 = (long *)(*(long *)(in_RDI + 0x30) + in_RSI * 0xe8);
            uVar1 = plVar3[(ulong)in_EDX + 1];
            pvVar5 = (void *)plVar3[(ulong)in_EDX + 0xd];
            if (uVar1 == 0) {
              if ((in_R9 == 0) && (sizeof_ent_ids != *(size_t *)(*plVar3 + (ulong)in_EDX * 8))) {
                return 10;
              }
            }
            else {
              if (pvVar5 == (void *)0x0) {
                return 7;
              }
              if (in_R9 == 0) {
                return 8;
              }
              if (*(uint *)((long)plVar3 + (ulong)in_EDX * 4 + 0x48) != in_ECX) {
                return 9;
              }
            }
            sVar2 = FmsIntTypeSize[in_ECX];
            if ((sizeof_ent_ids != 0) && (FVar4 = NextPow2(uVar1 + sizeof_ent_ids), in_R9 != 0)) {
              if (uVar1 <= FVar4 >> 1) {
                pvVar5 = realloc(pvVar5,FVar4 * sVar2);
                if (pvVar5 == (void *)0x0) {
                  return 0xb;
                }
                plVar3[(ulong)in_EDX + 0xd] = (long)pvVar5;
              }
              FmsIntConvertCopy(in_stack_00000210,in_stack_00000208,in_stack_00000204,
                                in_stack_000001f8,in_stack_000001f0);
            }
            plVar3[(ulong)in_EDX + 1] = uVar1 + sizeof_ent_ids;
            if (uVar1 == 0) {
              *(uint *)((long)plVar3 + (ulong)in_EDX * 4 + 0x48) = in_ECX;
            }
            local_4 = 0;
          }
          else {
            local_4 = 6;
          }
        }
        else {
          local_4 = 5;
        }
      }
      else {
        local_4 = 4;
      }
    }
    else {
      local_4 = 3;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int FmsComponentAddPartSubEntities(FmsComponent comp, FmsInt part_id,
                                   FmsEntityType type, FmsIntType id_store_type,
                                   FmsIntType ent_id_type, const void *ents,
                                   FmsInt num_ents) {
  if (!comp) { E_RETURN(1); }
  if (part_id >= comp->num_parts) { E_RETURN(2); }
  if (type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(3); }
  if (comp->dim != FMS_INVALID_DIM && comp->dim <= FmsEntityDim[type]) {
    E_RETURN(4);
  }
  if (id_store_type >= FMS_NUM_INT_TYPES) { E_RETURN(5); }
  if (ent_id_type >= FMS_NUM_INT_TYPES) { E_RETURN(6); }
  struct _FmsPart_private *part = comp->parts + part_id;
  const FmsInt num_entities = part->num_entities[type];
  void *entities_ids = part->entities_ids[type];
  if (num_entities != 0) {
    if (entities_ids == NULL) { E_RETURN(7); }
    if (ents == NULL) { E_RETURN(8); }
    if (part->entities_ids_type[type] != id_store_type) { E_RETURN(9); }
  } else if (ents == NULL) {
    if (num_ents != part->domain->num_entities[type]) { E_RETURN(10); }
  }
  const size_t sizeof_ent_ids = FmsIntTypeSize[id_store_type];
  if (num_ents != 0) {
    const FmsInt nc = NextPow2(num_entities + num_ents);
    if (ents != NULL) {
      if (num_entities <= nc/2) {
        entities_ids = realloc(entities_ids, nc*sizeof_ent_ids);
        if (entities_ids == NULL) { E_RETURN(11); }
        part->entities_ids[type] = entities_ids;
      }
      FmsIntConvertCopy(ent_id_type, ents, id_store_type,
                        (char*)entities_ids + num_entities*sizeof_ent_ids,
                        num_ents);
    } else {
      // part->entities_ids[type] is already NULL since num_entities is 0
    }
  }
  // Update the part
  part->num_entities[type] = num_entities + num_ents;
  if (num_entities == 0) {
    part->entities_ids_type[type] = id_store_type;
  }
  // Nothing to update in the component
  return 0;
}